

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O1

cmValue cmTargetPropertyComputer::GetProperty<cmTarget>(cmTarget *tgt,string *prop,cmMakefile *mf)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  
  cVar3 = GetLocation<cmTarget>(tgt,prop,mf);
  if (cVar3.Value == (string *)0x0) {
    if (cmSystemTools::s_FatalErrorOccurred == false) {
      bVar1 = cmSystemTools::GetInterruptFlag();
      if (!bVar1) {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          cVar3 = GetSources<cmTarget>(tgt,mf);
          return (cmValue)cVar3.Value;
        }
      }
    }
    cVar3.Value = (string *)0x0;
  }
  return (cmValue)cVar3.Value;
}

Assistant:

static cmValue GetProperty(Target const* tgt, const std::string& prop,
                             cmMakefile const& mf)
  {
    if (cmValue loc = GetLocation(tgt, prop, mf)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      return nullptr;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, mf);
    }
    return nullptr;
  }